

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O1

EStatusCode __thiscall
PDFWriter::ModifyPDF
          (PDFWriter *this,string *inModifiedFile,EPDFVersion inPDFVersion,
          string *inOptionalAlternativeOutputFile,LogConfiguration *inLogConfiguration,
          PDFCreationSettings *inPDFCreationSettings)

{
  OutputFile *this_00;
  size_t __n;
  int iVar1;
  EStatusCode EVar2;
  IByteWriter *inOutputStream;
  IByteReader *inInputStream;
  IByteWriterWithPosition *pIVar3;
  undefined4 uVar4;
  OutputStreamTraits traits;
  InputFile modifiedFileInput;
  OutputStreamTraits local_70;
  undefined4 local_64;
  InputFile local_60;
  
  SetupLog(this,inLogConfiguration);
  SetupCreationSettings(this,inPDFCreationSettings);
  __n = inOptionalAlternativeOutputFile->_M_string_length;
  if ((__n == 0) ||
     ((__n == inModifiedFile->_M_string_length &&
      (iVar1 = bcmp((inOptionalAlternativeOutputFile->_M_dataplus)._M_p,
                    (inModifiedFile->_M_dataplus)._M_p,__n), iVar1 == 0)))) {
    EVar2 = OutputFile::OpenFile(&this->mOutputFile,inModifiedFile,true);
    if (EVar2 != eSuccess) {
      return EVar2;
    }
    pIVar3 = OutputFile::GetOutputStream(&this->mOutputFile);
    ObjectsContext::SetOutputStream(&this->mObjectsContext,pIVar3);
  }
  else {
    this_00 = &this->mOutputFile;
    EVar2 = OutputFile::OpenFile(this_00,inOptionalAlternativeOutputFile,false);
    if (EVar2 != eSuccess) {
      return EVar2;
    }
    InputFile::InputFile(&local_60);
    EVar2 = InputFile::OpenFile(&local_60,inModifiedFile);
    if (EVar2 == eSuccess) {
      inOutputStream = &OutputFile::GetOutputStream(this_00)->super_IByteWriter;
      OutputStreamTraits::OutputStreamTraits(&local_70,inOutputStream);
      inInputStream = &InputFile::GetInputStream(&local_60)->super_IByteReader;
      EVar2 = OutputStreamTraits::CopyToOutputStream(&local_70,inInputStream);
      local_64 = CONCAT31((int3)((uint)EVar2 >> 8),EVar2 == eSuccess);
      if (EVar2 == eSuccess) {
        pIVar3 = OutputFile::GetOutputStream(this_00);
        ObjectsContext::SetOutputStream(&this->mObjectsContext,pIVar3);
        ObjectsContext::WriteTokenSeparator(&this->mObjectsContext,eTokenSeparatorEndLine);
      }
      OutputStreamTraits::~OutputStreamTraits(&local_70);
      uVar4 = local_64;
    }
    else {
      uVar4 = 0;
    }
    InputFile::~InputFile(&local_60);
    if ((char)uVar4 == '\0') {
      return EVar2;
    }
  }
  PDFHummus::DocumentContext::SetOutputFileInformation(&this->mDocumentContext,&this->mOutputFile);
  this->mIsModified = true;
  EVar2 = SetupStateFromModifiedFile(this,inModifiedFile,inPDFVersion,inPDFCreationSettings);
  return EVar2;
}

Assistant:

EStatusCode PDFWriter::ModifyPDF(const std::string& inModifiedFile,
                                            EPDFVersion inPDFVersion,
                                            const std::string& inOptionalAlternativeOutputFile,
                                            const LogConfiguration& inLogConfiguration,
                                            const PDFCreationSettings& inPDFCreationSettings)
{
    EStatusCode status = eSuccess;

    SetupLog(inLogConfiguration);
	SetupCreationSettings(inPDFCreationSettings);

    do
    {
        // either append to original file, or create a new copy and "modify" it. depending on users choice
        if(inOptionalAlternativeOutputFile.size() == 0 || (inOptionalAlternativeOutputFile == inModifiedFile))
        {
            status = mOutputFile.OpenFile(inModifiedFile,true);
            if(status != eSuccess)
                break;
			mObjectsContext.SetOutputStream(mOutputFile.GetOutputStream());
		}
        else
        {
            status = mOutputFile.OpenFile(inOptionalAlternativeOutputFile);
            if(status != eSuccess)
               break;

            // copy original to new output file
            InputFile modifiedFileInput;
            status = modifiedFileInput.OpenFile(inModifiedFile);
            if(status != eSuccess)
                break;

            OutputStreamTraits traits(mOutputFile.GetOutputStream());
            status = traits.CopyToOutputStream(modifiedFileInput.GetInputStream());
            if(status != eSuccess)
                break;

			// add an extra newline after eof, just in case the original file didn't have it
			mObjectsContext.SetOutputStream(mOutputFile.GetOutputStream());
			mObjectsContext.WriteTokenSeparator(eTokenSeparatorEndLine);
        }

        mDocumentContext.SetOutputFileInformation(&mOutputFile);

        // do setup for modification
        mIsModified = true;
        status = SetupStateFromModifiedFile(inModifiedFile, inPDFVersion, inPDFCreationSettings);
    }
    while (false);

    return status;
}